

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkResult
tonk_advertise(TonkSocket tonkSocket,char *ipString,uint16_t port,void *data,uint32_t bytes)

{
  void *in_RCX;
  uint16_t in_DX;
  char *in_RSI;
  TonkSocket in_RDI;
  uint32_t in_R8D;
  TonkResult local_4;
  
  if (fp_tonk_advertise == (fp_tonk_advertise_t)0x0) {
    local_4 = Tonk_DLL_Not_Found;
  }
  else {
    local_4 = (*fp_tonk_advertise)(in_RDI,in_RSI,in_DX,in_RCX,in_R8D);
  }
  return local_4;
}

Assistant:

TonkResult tonk_advertise(
    TonkSocket tonkSocket, ///< [in] Socket to send advertisement from
    const char*  ipString, ///< [in] Destination IP address
    uint16_t         port, ///< [in] Destination port
    const void*      data, ///< [in] Message data
    uint32_t        bytes  ///< [in] Message bytes
)
{
    if (!fp_tonk_advertise) {
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_advertise(
        tonkSocket,
        ipString,
        port,
        data,
        bytes);
}